

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O1

Builder * __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponseImpl::getResultsBuilder
          (Builder *__return_storage_ptr__,RpcServerResponseImpl *this)

{
  PointerBuilder local_20;
  
  local_20.segment = (this->payload)._builder.segment;
  local_20.capTable = (this->payload)._builder.capTable;
  local_20.pointer = (this->payload)._builder.pointers;
  PointerBuilder::imbue
            (&__return_storage_ptr__->builder,&local_20,&(this->capTable).super_CapTableBuilder);
  return __return_storage_ptr__;
}

Assistant:

AnyPointer::Builder getResultsBuilder() override {
      return capTable.imbue(payload.getContent());
    }